

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# ItemSimilarityRecommenderCommon.hpp
# Opt level: O1

void __thiscall
CoreML::Recommender::_ItemSimilarityRecommenderData::~_ItemSimilarityRecommenderData
          (_ItemSimilarityRecommenderData *this)

{
  anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
  *paVar1;
  pointer plVar2;
  pointer pcVar3;
  
  std::
  vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
  ::~vector(&this->string_id_values);
  plVar2 = (this->integer_id_values).super__Vector_base<long,_std::allocator<long>_>._M_impl.
           super__Vector_impl_data._M_start;
  if (plVar2 != (pointer)0x0) {
    operator_delete(plVar2,(long)(this->integer_id_values).
                                 super__Vector_base<long,_std::allocator<long>_>._M_impl.
                                 super__Vector_impl_data._M_end_of_storage - (long)plVar2);
  }
  pcVar3 = (this->item_score_output_column)._M_dataplus._M_p;
  paVar1 = &(this->item_score_output_column).field_2;
  if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
       *)pcVar3 != paVar1) {
    operator_delete(pcVar3,paVar1->_M_allocated_capacity + 1);
  }
  pcVar3 = (this->item_list_output_column)._M_dataplus._M_p;
  paVar1 = &(this->item_list_output_column).field_2;
  if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
       *)pcVar3 != paVar1) {
    operator_delete(pcVar3,paVar1->_M_allocated_capacity + 1);
  }
  pcVar3 = (this->item_data_input_column)._M_dataplus._M_p;
  paVar1 = &(this->item_data_input_column).field_2;
  if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
       *)pcVar3 != paVar1) {
    operator_delete(pcVar3,paVar1->_M_allocated_capacity + 1);
  }
  pcVar3 = (this->item_exclusion_input_column)._M_dataplus._M_p;
  paVar1 = &(this->item_exclusion_input_column).field_2;
  if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
       *)pcVar3 != paVar1) {
    operator_delete(pcVar3,paVar1->_M_allocated_capacity + 1);
  }
  pcVar3 = (this->num_recommendations_input_column)._M_dataplus._M_p;
  paVar1 = &(this->num_recommendations_input_column).field_2;
  if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
       *)pcVar3 != paVar1) {
    operator_delete(pcVar3,paVar1->_M_allocated_capacity + 1);
  }
  pcVar3 = (this->item_restriction_input_column)._M_dataplus._M_p;
  paVar1 = &(this->item_restriction_input_column).field_2;
  if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
       *)pcVar3 != paVar1) {
    operator_delete(pcVar3,paVar1->_M_allocated_capacity + 1);
  }
  std::
  _Rb_tree<unsigned_long,_std::pair<const_unsigned_long,_double>,_std::_Select1st<std::pair<const_unsigned_long,_double>_>,_std::less<unsigned_long>,_std::allocator<std::pair<const_unsigned_long,_double>_>_>
  ::~_Rb_tree(&(this->item_shift_values)._M_t);
  std::
  _Rb_tree<unsigned_long,_std::pair<const_unsigned_long,_std::vector<std::pair<unsigned_long,_double>,_std::allocator<std::pair<unsigned_long,_double>_>_>_>,_std::_Select1st<std::pair<const_unsigned_long,_std::vector<std::pair<unsigned_long,_double>,_std::allocator<std::pair<unsigned_long,_double>_>_>_>_>,_std::less<unsigned_long>,_std::allocator<std::pair<const_unsigned_long,_std::vector<std::pair<unsigned_long,_double>,_std::allocator<std::pair<unsigned_long,_double>_>_>_>_>_>
  ::~_Rb_tree((_Rb_tree<unsigned_long,_std::pair<const_unsigned_long,_std::vector<std::pair<unsigned_long,_double>,_std::allocator<std::pair<unsigned_long,_double>_>_>_>,_std::_Select1st<std::pair<const_unsigned_long,_std::vector<std::pair<unsigned_long,_double>,_std::allocator<std::pair<unsigned_long,_double>_>_>_>_>,_std::less<unsigned_long>,_std::allocator<std::pair<const_unsigned_long,_std::vector<std::pair<unsigned_long,_double>,_std::allocator<std::pair<unsigned_long,_double>_>_>_>_>_>
               *)this);
  return;
}

Assistant:

_ItemSimilarityRecommenderData(){}